

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int extend(int f,int n)

{
  line **pplVar1;
  line **pplVar2;
  line *__ptr;
  PF p_Var3;
  line *lp;
  char *bufp;
  char xname [64];
  PF funct;
  int n_local;
  int f_local;
  
  if ((f & 7U) == 0) {
    lp = (line *)eread("M-x ",(char *)&bufp,0x40,9);
  }
  else {
    lp = (line *)eread("%d M-x ",(char *)&bufp,0x40,9,(ulong)(uint)n);
  }
  if (lp == (line *)0x0) {
    n_local = 2;
  }
  else if (*(char *)&lp->l_fp == '\0') {
    n_local = 0;
  }
  else {
    p_Var3 = name_function((char *)lp);
    __ptr = maclcur;
    if (p_Var3 == (PF)0x0) {
      n_local = dobeep_msg("[No match]");
    }
    else {
      if (macrodef != 0) {
        macro[macrocount + -1].m_funct = p_Var3;
        pplVar1 = &maclcur->l_bp;
        pplVar2 = &maclcur->l_fp;
        maclcur = *pplVar1;
        (*pplVar1)->l_fp = *pplVar2;
        free(__ptr);
      }
      n_local = (*p_Var3)(f,n);
    }
  }
  return n_local;
}

Assistant:

int
extend(int f, int n)
{
	PF	 funct;
	char	 xname[NXNAME], *bufp;

	if (!(f & FFARG))
		bufp = eread("M-x ", xname, NXNAME, EFNEW | EFFUNC);
	else
		bufp = eread("%d M-x ", xname, NXNAME, EFNEW | EFFUNC, n);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	if ((funct = name_function(bufp)) != NULL) {
		if (macrodef) {
			struct line	*lp = maclcur;
			macro[macrocount - 1].m_funct = funct;
			maclcur = lp->l_bp;
			maclcur->l_fp = lp->l_fp;
			free(lp);
		}
		return ((*funct)(f, n));
	}
	return (dobeep_msg("[No match]"));
}